

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMetadata.cpp
# Opt level: O1

void __thiscall
utMetadata_get_set_string_Test_Test::TestBody(utMetadata_get_set_string_Test_Test *this)

{
  uint *puVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  aiMetadata *paVar7;
  aiString *paVar8;
  aiMetadataEntry *paVar9;
  undefined4 *puVar10;
  void *pvVar11;
  bool abVar12 [8];
  byte extraout_DL;
  ulong uVar13;
  ulong extraout_RDX;
  ulong uVar14;
  ulong uVar15;
  char cVar16;
  size_t sVar17;
  char *message;
  char *in_R9;
  long lVar18;
  long lVar19;
  char *__end;
  size_t sVar20;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__2;
  string key;
  aiString result;
  AssertHelper local_8b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8b0;
  AssertHelper local_8a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8a0;
  undefined1 local_898 [24];
  _Alloc_hider local_880;
  aiMetadata *local_878;
  bool local_870 [8];
  string local_868 [8];
  ulong local_860;
  undefined1 local_858 [16];
  aiMetadataEntry *local_848;
  aiString local_840;
  undefined1 local_438 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  undefined1 local_428 [1016];
  
  paVar7 = (aiMetadata *)operator_new(0x18);
  paVar7->mKeys = (aiString *)0x0;
  paVar7->mValues = (aiMetadataEntry *)0x0;
  paVar7->mNumProperties = 1;
  paVar8 = (aiString *)operator_new__(0x404);
  paVar8->length = 0;
  paVar8->data[0] = '\0';
  memset(paVar8->data + 1,0x1b,0x3ff);
  paVar7->mKeys = paVar8;
  paVar9 = (aiMetadataEntry *)operator_new__(0x10);
  *(undefined8 *)paVar9 = 0;
  paVar9->mData = (void *)0x0;
  paVar7->mValues = paVar9;
  (this->super_utMetadata).m_data = paVar7;
  local_868 = (string  [8])local_858;
  std::__cxx11::string::_M_construct<char_const*>(local_868,"test","");
  paVar7 = (this->super_utMetadata).m_data;
  local_878 = (aiMetadata *)this;
  local_438 = (undefined1  [8])local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"test","");
  sVar20 = 0x3ff;
  if (((ulong)local_430.ptr_ & 0xfffffc00) == 0) {
    sVar20 = (ulong)local_430.ptr_ & 0xffffffff;
  }
  local_840.length = (uint)sVar20;
  memcpy((void *)((long)&local_840 + 4),(void *)local_438,sVar20);
  uVar15 = local_860;
  *(undefined1 *)((long)&local_840 + sVar20 + 4) = 0;
  if ((paVar7->mNumProperties == 0) || (local_860 == 0)) {
    cVar16 = '\0';
  }
  else {
    if (local_860 < 0x400) {
      paVar8 = paVar7->mKeys;
      paVar8->length = (ai_uint32)local_860;
      memcpy(paVar8->data,(void *)local_868,local_860);
      paVar8->data[uVar15] = '\0';
    }
    paVar7->mValues->mType = AI_AISTRING;
    puVar10 = (undefined4 *)operator_new(0x404);
    sVar17 = 0x3ff;
    if ((uint)sVar20 < 0x3ff) {
      sVar17 = sVar20;
    }
    *puVar10 = (int)sVar17;
    memcpy(puVar10 + 1,(void *)((long)&local_840 + 4),sVar17);
    *(undefined1 *)((long)puVar10 + sVar17 + 4) = 0;
    paVar7->mValues->mData = puVar10;
    cVar16 = '\x01';
  }
  if (local_438 != (undefined1  [8])local_428) {
    operator_delete((void *)local_438);
  }
  local_438[0] = cVar16;
  local_430.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar16 == '\0') {
    testing::Message::Message((Message *)&local_8a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_840,(internal *)local_438,(AssertionResult *)0x75c69d,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0x99,(char *)local_840._0_8_);
    testing::internal::AssertHelper::operator=(&local_8b8,(Message *)&local_8a8);
    testing::internal::AssertHelper::~AssertHelper(&local_8b8);
    if ((char *)local_840._0_8_ != local_840.data + 0xc) {
      operator_delete((void *)local_840._0_8_);
    }
    if (local_8a8.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_8a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_8a8.data_ + 8))();
      }
      local_8a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar9 = local_878->mValues;
  local_438 = (undefined1  [8])local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"test","");
  sVar20 = 0x3ff;
  if (((ulong)local_430.ptr_ & 0xfffffc00) == 0) {
    sVar20 = (ulong)local_430.ptr_ & 0xffffffff;
  }
  local_840.length = (uint)sVar20;
  memcpy((void *)((long)&local_840 + 4),(void *)local_438,sVar20);
  uVar15 = local_860;
  *(undefined1 *)((long)&local_840 + sVar20 + 4) = 0;
  cVar16 = '\x01';
  if ((10 < paVar9->mType) && (local_860 != 0)) {
    if (local_860 < 0x400) {
      pvVar11 = paVar9->mData;
      *(int *)((long)pvVar11 + 0x2828) = (int)local_860;
      memcpy((void *)((long)pvVar11 + 0x282c),(void *)local_868,local_860);
      *(undefined1 *)((long)pvVar11 + uVar15 + 0x282c) = 0;
    }
    *(undefined4 *)(*(long *)(paVar9 + 1) + 0xa0) = 5;
    puVar10 = (undefined4 *)operator_new(0x404);
    sVar17 = 0x3ff;
    if ((uint)sVar20 < 0x3ff) {
      sVar17 = sVar20;
    }
    *puVar10 = (int)sVar17;
    memcpy(puVar10 + 1,(void *)((long)&local_840 + 4),sVar17);
    *(undefined1 *)((long)puVar10 + sVar17 + 4) = 0;
    *(undefined4 **)(*(long *)(paVar9 + 1) + 0xa8) = puVar10;
    cVar16 = '\0';
  }
  if (local_438 != (undefined1  [8])local_428) {
    operator_delete((void *)local_438);
  }
  local_438[0] = cVar16;
  local_430.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar16 == '\0') {
    testing::Message::Message((Message *)&local_8a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_840,(internal *)local_438,(AssertionResult *)0x75c69d,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0x9c,(char *)local_840._0_8_);
    testing::internal::AssertHelper::operator=(&local_8b8,(Message *)&local_8a8);
    testing::internal::AssertHelper::~AssertHelper(&local_8b8);
    if ((char *)local_840._0_8_ != local_840.data + 0xc) {
      operator_delete((void *)local_840._0_8_);
    }
    if (local_8a8.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_8a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_8a8.data_ + 8))();
      }
      local_8a8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_438 = (undefined1  [8])((ulong)local_438 & 0xffffff0000000000);
  memset(local_438 + 5,0x1b,0x3ff);
  paVar9 = local_878->mValues;
  sVar20 = 0x3ff;
  if ((local_860 & 0xfffffc00) == 0) {
    sVar20 = local_860 & 0xffffffff;
  }
  local_840.length = (uint)sVar20;
  pvVar11 = memcpy((void *)((long)&local_840 + 4),(void *)local_868,sVar20);
  *(undefined1 *)((long)&local_840 + sVar20 + 4) = 0;
  uVar13 = (ulong)paVar9->mType;
  bVar3 = uVar13 != 0;
  uVar15 = CONCAT71((int7)((ulong)pvVar11 >> 8),bVar3);
  if (uVar13 == 0) {
    local_870[0] = bVar3;
    local_880._M_p._0_4_ = (int)uVar15;
  }
  else {
    pvVar11 = (void *)((long)paVar9->mData + 4);
    local_870[0] = true;
    uVar14 = 1;
    lVar18 = 0;
    local_848 = paVar9;
    do {
      if (*(uint *)((long)pvVar11 + -4) == (uint)sVar20) {
        uVar5 = bcmp(pvVar11,(void *)((long)&local_840 + 4),(ulong)*(uint *)((long)pvVar11 + -4));
        uVar15 = (ulong)uVar5;
        if (uVar5 == 0) {
          lVar19 = *(long *)(local_848 + 1);
          if (*(int *)(lVar19 + lVar18) == 5) {
            puVar1 = *(uint **)(lVar19 + 8 + lVar18);
            local_880._M_p._0_4_ = (int)CONCAT71((int7)((ulong)lVar19 >> 8),1);
            if (puVar1 != (uint *)local_438) {
              uVar5 = *puVar1;
              local_438._0_4_ = uVar5;
              memcpy(local_438 + 4,puVar1 + 1,(ulong)uVar5);
              local_438[(ulong)uVar5 + 4] = 0;
            }
          }
          else {
            local_880._M_p = (pointer)((ulong)local_880._M_p._4_4_ << 0x20);
          }
          break;
        }
      }
      local_870[0] = uVar14 < uVar13;
      lVar18 = lVar18 + 0x10;
      uVar14 = uVar14 + 1;
      pvVar11 = (void *)((long)pvVar11 + 0x404);
      local_880._M_p._0_4_ = (int)uVar15;
    } while (uVar13 << 4 != lVar18);
  }
  local_8a8.data_ = (AssertHelperData *)local_898;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a8,"test","");
  sVar20 = 0x3ff;
  if (((ulong)local_8a0.ptr_ & 0xfffffc00) == 0) {
    sVar20 = (ulong)local_8a0.ptr_ & 0xffffffff;
  }
  local_840.length = (int)sVar20;
  memcpy((void *)((long)&local_840 + 4),local_8a8.data_,sVar20);
  *(undefined1 *)((long)&local_840 + sVar20 + 4) = 0;
  testing::internal::CmpHelperEQ<aiString,aiString>
            ((internal *)&local_8b8,"aiString( std::string( \"test\" ) )","result",&local_840,
             (aiString *)local_438);
  _Var2._M_p = local_880._M_p;
  if (local_8a8.data_ != (AssertHelperData *)local_898) {
    operator_delete(local_8a8.data_);
  }
  if (local_8b8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_840);
    if (local_8b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_8b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_8a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0xa0,message);
    testing::internal::AssertHelper::operator=(&local_8a8,(Message *)&local_840);
    testing::internal::AssertHelper::~AssertHelper(&local_8a8);
    if ((long *)local_840._0_8_ != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_840._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_840._0_8_ + 8))();
      }
      local_840._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = local_870[0] & (byte)_Var2._M_p;
  local_8a8.data_ = (AssertHelperData *)(CONCAT71(local_8a8.data_._1_7_,bVar4) & 0xffffffffffffff01)
  ;
  local_8a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bVar4 & 1) == 0) {
    testing::Message::Message((Message *)&local_8b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_840,(internal *)&local_8a8,(AssertionResult *)0x75c69d,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_898 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0xa1,(char *)local_840._0_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_898 + 0x10),(Message *)&local_8b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_898 + 0x10));
    if ((char *)local_840._0_8_ != local_840.data + 0xc) {
      operator_delete((void *)local_840._0_8_);
    }
    if (local_8b8.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_8b8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_8b8.data_ + 8))();
      }
      local_8b8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar7 = (aiMetadata *)local_878->mValues;
  local_8a8.data_ = (AssertHelperData *)local_898;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a8,"bla","");
  sVar20 = 0x3ff;
  if (((ulong)local_8a0.ptr_ & 0xfffffc00) == 0) {
    sVar20 = (ulong)local_8a0.ptr_ & 0xffffffff;
  }
  local_840.length = (uint)sVar20;
  local_880._M_p = (pointer)local_8a8.data_;
  memcpy((void *)((long)&local_840 + 4),local_8a8.data_,sVar20);
  *(undefined1 *)((long)&local_840 + sVar20 + 4) = 0;
  abVar12 = (bool  [8])
            (ulong)*(uint *)&(((utMetadata *)&paVar7->mNumProperties)->super_Test)._vptr_Test;
  bVar3 = abVar12 != (bool  [8])0x0;
  bVar4 = extraout_DL;
  if (bVar3) {
    lVar18 = (long)abVar12 << 4;
    pvVar11 = &((scoped_ptr<testing::internal::GTestFlagSaver> *)&paVar7->mKeys)->ptr_->field_0x4;
    bVar3 = true;
    uVar15 = 1;
    lVar19 = 0;
    local_878 = paVar7;
    local_870 = abVar12;
    do {
      uVar13 = (ulong)*(uint *)((long)pvVar11 + -4);
      if ((*(uint *)((long)pvVar11 + -4) == (uint)sVar20) &&
         (iVar6 = bcmp(pvVar11,(void *)((long)&local_840 + 4),uVar13), abVar12 = local_870,
         uVar13 = extraout_RDX, iVar6 == 0)) {
        if (*(int *)((long)&((aiMetadata *)local_878->mValues)->mNumProperties + lVar19) == 5) {
          puVar1 = *(uint **)((long)&((aiMetadata *)local_878->mValues)->mKeys + lVar19);
          bVar4 = 1;
          if (puVar1 != (uint *)local_438) {
            uVar5 = *puVar1;
            local_438._0_4_ = uVar5;
            memcpy(local_438 + 4,puVar1 + 1,(ulong)uVar5);
            bVar4 = 1;
            local_438[(ulong)uVar5 + 4] = 0;
          }
        }
        else {
          bVar4 = 0;
        }
        break;
      }
      bVar4 = (byte)uVar13;
      bVar3 = uVar15 < (ulong)abVar12;
      lVar19 = lVar19 + 0x10;
      uVar15 = uVar15 + 1;
      pvVar11 = (void *)((long)pvVar11 + 0x404);
    } while (lVar18 != lVar19);
  }
  if ((AssertHelperData *)local_880._M_p != (AssertHelperData *)local_898) {
    operator_delete(local_880._M_p);
  }
  local_8a8.data_ =
       (AssertHelperData *)(CONCAT71(local_8a8.data_._1_7_,~(bVar3 & bVar4)) & 0xffffffffffffff01);
  local_8a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bVar3 & bVar4) != 0) {
    testing::Message::Message((Message *)&local_8b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_840,(internal *)&local_8a8,(AssertionResult *)0x75c69d,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_898 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0xa4,(char *)local_840._0_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_898 + 0x10),(Message *)&local_8b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_898 + 0x10));
    if ((char *)local_840._0_8_ != local_840.data + 0xc) {
      operator_delete((void *)local_840._0_8_);
    }
    if (local_8b8.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_8b8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_8b8.data_ + 8))();
      }
      local_8b8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_868 != (string  [8])local_858) {
    operator_delete((void *)local_868);
  }
  return;
}

Assistant:

TEST_F( utMetadata, get_set_string_Test ) {
    m_data = aiMetadata::Alloc( 1 );

    unsigned int index( 0 );
    bool success( false );
    const std::string key = "test";
    success = m_data->Set( index, key, aiString( std::string( "test" ) ) );
    EXPECT_TRUE( success );

    success = m_data->Set( index+10, key, aiString( std::string( "test" ) ) );
    EXPECT_FALSE( success );

    aiString result;
    success = m_data->Get( key, result );
    EXPECT_EQ( aiString( std::string( "test" ) ), result );
    EXPECT_TRUE( success );

    success = m_data->Get( "bla", result );
    EXPECT_FALSE( success );
}